

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::VariableDatum::SetDatumValue(VariableDatum *this,KOCTET *data,KUINT32 sizeInBits)

{
  double dVar1;
  ushort local_2c;
  KUINT16 j;
  DatumEntry de;
  KUINT16 i;
  KUINT32 sizeInOctets;
  KUINT32 sizeInBits_local;
  KOCTET *data_local;
  VariableDatum *this_local;
  
  unique0x100000b0 = sizeInBits;
  std::
  vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ::clear(&this->m_v8DatumValue);
  dVar1 = ceil((double)stack0xffffffffffffffe4 * 0.125);
  de.Buffer._2_4_ = SUB84((long)dVar1,0);
  de.Buffer[0] = '\0';
  de.Buffer[1] = '\0';
  while ((uint)(ushort)de.Buffer._0_2_ < (uint)de.Buffer._2_4_) {
    DatumEntry::DatumEntry((DatumEntry *)&stack0xffffffffffffffd6);
    for (local_2c = 0; local_2c < 8 && (uint)(ushort)de.Buffer._0_2_ < (uint)de.Buffer._2_4_;
        local_2c = local_2c + 1) {
      (&stack0xffffffffffffffd6)[local_2c] = data[(ushort)de.Buffer._0_2_];
      de.Buffer._0_2_ = de.Buffer._0_2_ + 1;
    }
    std::
    vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
    ::push_back(&this->m_v8DatumValue,(value_type *)&stack0xffffffffffffffd6);
  }
  this->m_ui32DatumLength = stack0xffffffffffffffe4;
  return;
}

Assistant:

void VariableDatum::SetDatumValue( const KOCTET * data, KUINT32 sizeInBits )
{
    m_v8DatumValue.clear();

    KUINT32 sizeInOctets = ceil( sizeInBits / 8.0 );
    for( KUINT16 i = 0; i < sizeInOctets; )
    {
        DatumEntry de;

        for( KUINT16 j = 0; j < 8 && i < sizeInOctets; ++j, ++i )
        {
            de.Buffer[j] = data[i];
        }
        m_v8DatumValue.push_back( de );
    }

    m_ui32DatumLength = sizeInBits;
}